

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O1

TValue * cpcparser(lua_State *L,lua_CFunction dummy,void *ud)

{
  int iVar1;
  BCLine hashline;
  byte *pbVar2;
  CTState *cts;
  long lVar3;
  undefined1 uVar4;
  bool bVar5;
  char cVar6;
  uint uVar7;
  CTypeID CVar8;
  CPToken CVar9;
  CPscl CVar10;
  CTypeID id;
  ulong uVar11;
  int iVar12;
  CType *ct;
  CPDecl decl;
  CType *local_9e8;
  int local_9dc;
  CType *local_9d8;
  CPDecl local_9d0;
  
  *(undefined4 *)((long)L->cframe + 0xc) = 0xffffffff;
  *(undefined8 *)((long)ud + 0x68) = 1;
  *(undefined1 *)((long)ud + 0x7f) = 0;
  *(undefined1 *)((long)ud + 0x78) = 0xff;
  pbVar2 = *(byte **)((long)ud + 0x20);
  *(undefined8 *)((long)ud + 0x40) = *(undefined8 *)((long)ud + 0x48);
  *(undefined8 *)((long)ud + 0x28) = 0;
  *(undefined8 *)((long)ud + 0x30) = 0;
  *(undefined8 *)((long)ud + 0x38) = 0;
  *(byte **)((long)ud + 0x20) = pbVar2 + 1;
  uVar7 = (uint)*pbVar2;
  *(uint *)ud = uVar7;
  if (uVar7 == 0x5c) {
    cp_get_bs((CPState *)ud);
  }
  *(undefined4 *)((long)ud + 4) = 0;
  *(undefined4 *)((long)ud + 0x70) = 0x38c0;
  cp_next((CPState *)ud);
  if ((*(byte *)((long)ud + 0x74) & 1) == 0) {
    cp_decl_spec((CPState *)ud,&local_9d0,0);
    cp_declarator((CPState *)ud,&local_9d0);
    CVar8 = cp_decl_intern((CPState *)ud,&local_9d0);
    *(CTypeID *)((long)ud + 0xc) = CVar8;
    if (*(int *)((long)ud + 4) != 0x103) {
      cp_err_token((CPState *)ud,0x103);
    }
  }
  else {
    iVar12 = 1;
    do {
      iVar1 = *(int *)((long)ud + 4);
      if (iVar1 == 0x103) break;
      if (iVar1 == 0x23) {
        hashline = *(BCLine *)((long)ud + 0x68);
        CVar9 = cp_next((CPState *)ud);
        if (CVar9 == 0x100) {
          lVar3 = *(long *)((long)ud + 0x10);
          if (*(int *)(lVar3 + 0x14) == 6) {
            if (*(short *)(lVar3 + 0x1c) == 0x616d && *(int *)(lVar3 + 0x18) == 0x67617270) {
              cp_next((CPState *)ud);
              if (*(int *)((long)ud + 4) != 0x103) {
                if (((*(int *)((long)ud + 4) == 0x100) &&
                    (*(int *)(*(long *)((long)ud + 0x10) + 0x14) == 4)) &&
                   (*(int *)(*(long *)((long)ud + 0x10) + 0x18) == 0x6b636170)) {
                  cp_next((CPState *)ud);
                  cp_check((CPState *)ud,0x28);
                  if (*(int *)((long)ud + 4) == 0x100) {
                    lVar3 = *(long *)((long)ud + 0x10);
                    CVar9 = 0x100;
                    if (*(int *)(lVar3 + 0x14) == 3) {
                      if (*(char *)(lVar3 + 0x1a) != 'p' || *(short *)(lVar3 + 0x18) != 0x6f70)
                      goto LAB_0014ebb1;
                      if (*(char *)((long)ud + 0x7f) != '\0') {
                        cVar6 = *(char *)((long)ud + 0x7f) + -1;
                        goto LAB_0014eb30;
                      }
                    }
                    else {
                      if ((*(int *)(lVar3 + 0x14) != 4) || (*(int *)(lVar3 + 0x18) != 0x68737570))
                      goto LAB_0014ebb1;
                      uVar11 = (ulong)*(byte *)((long)ud + 0x7f);
                      if (uVar11 < 7) {
                        *(undefined1 *)((long)ud + uVar11 + 0x79) =
                             *(undefined1 *)((long)ud + uVar11 + 0x78);
                        cVar6 = *(char *)((long)ud + 0x7f) + '\x01';
LAB_0014eb30:
                        *(char *)((long)ud + 0x7f) = cVar6;
                      }
                    }
                    cp_next((CPState *)ud);
                    if (*(int *)((long)ud + 4) == 0x2c) {
                      cp_next((CPState *)ud);
                      goto LAB_0014eb49;
                    }
                  }
                  else {
LAB_0014eb49:
                    if (*(int *)((long)ud + 4) == 0x102) {
                      uVar7 = *(uint *)((long)ud + 8);
                      iVar1 = 0x1f;
                      if (uVar7 != 0) {
                        for (; uVar7 >> iVar1 == 0; iVar1 = iVar1 + -1) {
                        }
                      }
                      uVar4 = (undefined1)iVar1;
                      if (uVar7 == 0) {
                        uVar4 = 0;
                      }
                      *(undefined1 *)((long)ud + (ulong)*(byte *)((long)ud + 0x7f) + 0x78) = uVar4;
                      cp_next((CPState *)ud);
                    }
                    else {
                      *(undefined1 *)((long)ud + (ulong)*(byte *)((long)ud + 0x7f) + 0x78) = 0xff;
                    }
                  }
                  cp_check((CPState *)ud,0x29);
                }
                else {
                  do {
                    if (*(int *)((long)ud + 0x68) != hashline) break;
                    cp_next((CPState *)ud);
                  } while (*(int *)((long)ud + 4) != 0x103);
                }
              }
LAB_0014e7ff:
              bVar5 = false;
              goto LAB_0014ea01;
            }
          }
          else if ((*(int *)(lVar3 + 0x14) == 4) && (*(int *)(lVar3 + 0x18) == 0x656e696c)) {
            CVar9 = cp_next((CPState *)ud);
            if (CVar9 != 0x102) {
              cp_err_token((CPState *)ud,0x100);
            }
            goto LAB_0014e7f5;
          }
        }
        else if (CVar9 == 0x102) {
LAB_0014e7f5:
          cp_line((CPState *)ud,hashline);
          goto LAB_0014e7ff;
        }
        CVar9 = *(CPToken *)((long)ud + 4);
LAB_0014ebb1:
        cp_errmsg((CPState *)ud,CVar9,LJ_ERR_XSYMBOL);
      }
      if (iVar1 == 0x3b) {
        cp_next((CPState *)ud);
LAB_0014e9fc:
        bVar5 = false;
        iVar12 = 0;
      }
      else {
        local_9dc = iVar12;
        CVar10 = cp_decl_spec((CPState *)ud,&local_9d0,0x38000);
        if ((((*(int *)((long)ud + 4) != 0x103) && (*(int *)((long)ud + 4) != 0x3b)) ||
            ((local_9d0.stack[0].info & 0xf0000000) != 0x70000000)) ||
           (((*(uint *)(**(long **)((long)ud + 0x50) + (ulong)(ushort)local_9d0.stack[0].info * 0x18
                       ) >> 0x1c) - 1 & 0xfffffffb) != 0)) {
          do {
            cp_declarator((CPState *)ud,&local_9d0);
            CVar8 = cp_decl_intern((CPState *)ud,&local_9d0);
            if ((local_9d0.name != (GCstr *)0x0) && (local_9d0.nameid == 0)) {
              cts = *(CTState **)((long)ud + 0x50);
              if ((short)CVar10 < 0) {
                id = lj_ctype_new(cts,&local_9e8);
                local_9e8->info = CVar8 + 0x70000000;
              }
              else {
                if ((cts->tab[CVar8].info & 0xf0000000) == 0x60000000) {
                  local_9e8 = cts->tab + CVar8;
                  id = CVar8;
                }
                else {
                  if ((CVar10 >> 0x11 & 1) != 0) {
                    id = cp_decl_constinit((CPState *)ud,&local_9e8,CVar8);
                    goto LAB_0014e95f;
                  }
                  id = lj_ctype_new(cts,&local_9e8);
                  local_9e8->info = CVar8 + 0xc0000000;
                }
                if (local_9d0.redir != (GCstr *)0x0) {
                  CVar8 = lj_ctype_new(*(CTState **)((long)ud + 0x50),&local_9d8);
                  local_9e8 = (CType *)(**(long **)((long)ud + 0x50) + (ulong)id * 0x18);
                  local_9d8->info = 0x80040000;
                  local_9d8->sib = local_9e8->sib;
                  local_9e8->sib = (CTypeID1)CVar8;
                  (local_9d0.redir)->marked = (local_9d0.redir)->marked | 0x20;
                  (local_9d8->name).gcptr64 = (uint64_t)local_9d0.redir;
                }
              }
LAB_0014e95f:
              (local_9d0.name)->marked = (local_9d0.name)->marked | 0x20;
              (local_9e8->name).gcptr64 = (uint64_t)local_9d0.name;
              lj_ctype_addname(*(CTState **)((long)ud + 0x50),local_9e8,id);
            }
            if (*(int *)((long)ud + 4) != 0x2c) break;
            cp_next((CPState *)ud);
            local_9d0.pos = local_9d0.specpos;
            local_9d0.top = local_9d0.specpos + 1;
            local_9d0.stack[local_9d0.specpos].next = 0;
            local_9d0.name = (GCstr *)0x0;
            local_9d0.redir = (GCstr *)0x0;
          } while( true );
        }
        if (*(int *)((long)ud + 4) != 0x103 || local_9dc == 0) {
          cp_check((CPState *)ud,0x3b);
          goto LAB_0014e9fc;
        }
        iVar12 = 1;
        bVar5 = true;
      }
LAB_0014ea01:
    } while (!bVar5);
  }
  if ((*(long *)((long)ud + 0x58) != 0) &&
     (*(long *)((long)ud + 0x58) != *(long *)(*(long *)((long)ud + 0x48) + 0x28))) {
    cp_err((CPState *)ud,LJ_ERR_FFI_NUMPARAM);
  }
  return (TValue *)0x0;
}

Assistant:

static TValue *cpcparser(lua_State *L, lua_CFunction dummy, void *ud)
{
  CPState *cp = (CPState *)ud;
  UNUSED(dummy);
  cframe_errfunc(L->cframe) = -1;  /* Inherit error function. */
  cp_init(cp);
  if ((cp->mode & CPARSE_MODE_MULTI))
    cp_decl_multi(cp);
  else
    cp_decl_single(cp);
  if (cp->param && cp->param != cp->L->top)
    cp_err(cp, LJ_ERR_FFI_NUMPARAM);
  lj_assertCP(cp->depth == 0, "unbalanced cparser declaration depth");
  return NULL;
}